

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O2

UntypedActionResultHolderBase * __thiscall
testing::internal::FunctionMockerBase<TestResult_(mp::Reference)>::UntypedPerformAction
          (FunctionMockerBase<TestResult_(mp::Reference)> *this,void *untyped_action,
          void *untyped_args)

{
  ActionResultHolder<TestResult> *pAVar1;
  Action<TestResult_(mp::Reference)> action;
  linked_ptr<testing::ActionInterface<TestResult_(mp::Reference)>_> local_20;
  
  linked_ptr<testing::ActionInterface<TestResult(mp::Reference)>>::
  copy<testing::ActionInterface<TestResult(mp::Reference)>>
            ((linked_ptr<testing::ActionInterface<TestResult(mp::Reference)>> *)&local_20,
             (linked_ptr<testing::ActionInterface<TestResult_(mp::Reference)>_> *)untyped_action);
  pAVar1 = ActionResultHolder<TestResult>::PerformAction<TestResult(mp::Reference)>
                     ((Action<TestResult_(mp::Reference)> *)&local_20,(ArgumentTuple *)untyped_args)
  ;
  linked_ptr<testing::ActionInterface<TestResult_(mp::Reference)>_>::~linked_ptr(&local_20);
  return &pAVar1->super_UntypedActionResultHolderBase;
}

Assistant:

virtual UntypedActionResultHolderBase* UntypedPerformAction(
      const void* untyped_action, const void* untyped_args) const {
    // Make a copy of the action before performing it, in case the
    // action deletes the mock object (and thus deletes itself).
    const Action<F> action = *static_cast<const Action<F>*>(untyped_action);
    const ArgumentTuple& args =
        *static_cast<const ArgumentTuple*>(untyped_args);
    return ResultHolder::PerformAction(action, args);
  }